

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

void __thiscall OpenMD::ZConstraintForceModifier::doZconstraintForce(ZConstraintForceModifier *this)

{
  double dVar1;
  bool bVar2;
  pointer pZVar3;
  reference ppMVar4;
  double *pdVar5;
  RealType RVar6;
  Vector3d force_2;
  iterator j;
  Vector3d force_1;
  Vector3d force;
  IntegrableObjectIterator ii;
  StuntDouble *sd;
  Molecule *mol;
  iterator i;
  RealType totalFZ;
  Vector<double,_3U> *in_stack_fffffffffffffe88;
  Vector3<double> *in_stack_fffffffffffffe90;
  Molecule *in_stack_fffffffffffffe98;
  Molecule *in_stack_fffffffffffffea0;
  Molecule *in_stack_fffffffffffffea8;
  Molecule *in_stack_fffffffffffffeb0;
  double local_138;
  Vector<double,_3U> local_130;
  Vector<double,_3U> local_118;
  Molecule **local_100;
  Molecule **local_f8;
  __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  local_f0;
  double local_e8;
  Vector<double,_3U> local_e0;
  Vector<double,_3U> local_c8;
  _Self local_b0;
  _List_node_base *local_a8;
  double local_a0;
  Vector<double,_3U> local_98;
  Vector<double,_3U> local_80;
  _Self local_68;
  _List_node_base *local_60;
  Vector<double,_3U> local_58;
  _Self local_40;
  _List_node_base *local_38;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_30;
  Molecule *local_28;
  Molecule *local_20;
  _List_iterator<OpenMD::ZconstraintMol> local_18;
  double local_10;
  
  local_10 = 0.0;
  std::_List_iterator<OpenMD::ZconstraintMol>::_List_iterator(&local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_30);
  local_38 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
             begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   in_stack_fffffffffffffe88);
  local_18._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffe88);
    bVar2 = std::operator!=(&local_18,&local_40);
    if (!bVar2) break;
    pZVar3 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x327ab9);
    local_20 = pZVar3->mol;
    pZVar3 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x327ad1);
    pZVar3->fz = 0.0;
    local_28 = (Molecule *)
               Molecule::beginIntegrableObject
                         (in_stack_fffffffffffffeb0,(iterator *)in_stack_fffffffffffffea8);
    while (local_28 != (Molecule *)0x0) {
      StuntDouble::getFrc((StuntDouble *)in_stack_fffffffffffffe98);
      pdVar5 = Vector<double,_3U>::operator[](&local_58,2);
      dVar1 = *pdVar5;
      pZVar3 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                         ((_List_iterator<OpenMD::ZconstraintMol> *)0x327b3f);
      pZVar3->fz = dVar1 + pZVar3->fz;
      local_28 = (Molecule *)
                 Molecule::nextIntegrableObject
                           (in_stack_fffffffffffffeb0,(iterator *)in_stack_fffffffffffffea8);
    }
    pZVar3 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x327b7b);
    local_10 = pZVar3->fz + local_10;
    std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_18);
  }
  local_60 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
             begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   in_stack_fffffffffffffe88);
  local_18._M_node = local_60;
  while( true ) {
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffe88);
    bVar2 = std::operator!=(&local_18,&local_68);
    if (!bVar2) break;
    pZVar3 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x327c0b);
    local_20 = pZVar3->mol;
    local_28 = (Molecule *)
               Molecule::beginIntegrableObject
                         (in_stack_fffffffffffffeb0,(iterator *)in_stack_fffffffffffffea8);
    while (local_28 != (Molecule *)0x0) {
      local_a0 = 0.0;
      Vector<double,_3U>::Vector(&local_98,&local_a0);
      Vector3<double>::Vector3(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      in_stack_fffffffffffffea0 = local_20;
      in_stack_fffffffffffffea8 = local_28;
      std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                ((_List_iterator<OpenMD::ZconstraintMol> *)0x327c9f);
      RVar6 = getZFOfFixedZMols((ZConstraintForceModifier *)in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffea8,(StuntDouble *)in_stack_fffffffffffffea0,
                                (RealType)in_stack_fffffffffffffe98);
      in_stack_fffffffffffffeb0 = (Molecule *)((ulong)RVar6 ^ 0x8000000000000000);
      pdVar5 = Vector<double,_3U>::operator[](&local_80,2);
      *pdVar5 = (double)in_stack_fffffffffffffeb0;
      StuntDouble::addFrc((StuntDouble *)in_stack_fffffffffffffea0,
                          (Vector3d *)in_stack_fffffffffffffe98);
      local_28 = (Molecule *)
                 Molecule::nextIntegrableObject
                           (in_stack_fffffffffffffeb0,(iterator *)in_stack_fffffffffffffea8);
    }
    std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_18);
  }
  local_a8 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
             begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   in_stack_fffffffffffffe88);
  local_18._M_node = local_a8;
  while( true ) {
    local_b0._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffe88);
    bVar2 = std::operator!=(&local_18,&local_b0);
    if (!bVar2) break;
    pZVar3 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x327da3);
    local_20 = pZVar3->mol;
    local_e8 = 0.0;
    Vector<double,_3U>::Vector(&local_e0,&local_e8);
    Vector3<double>::Vector3(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    RVar6 = getZFOfMovingMols((ZConstraintForceModifier *)in_stack_fffffffffffffea0,
                              in_stack_fffffffffffffe98,(RealType)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe98 = (Molecule *)((ulong)RVar6 ^ 0x8000000000000000);
    pdVar5 = Vector<double,_3U>::operator[](&local_c8,2);
    *pdVar5 = (double)in_stack_fffffffffffffe98;
    local_28 = (Molecule *)
               Molecule::beginIntegrableObject
                         (in_stack_fffffffffffffeb0,(iterator *)in_stack_fffffffffffffea8);
    while (local_28 != (Molecule *)0x0) {
      StuntDouble::addFrc((StuntDouble *)in_stack_fffffffffffffea0,
                          (Vector3d *)in_stack_fffffffffffffe98);
      local_28 = (Molecule *)
                 Molecule::nextIntegrableObject
                           (in_stack_fffffffffffffeb0,(iterator *)in_stack_fffffffffffffea8);
    }
    std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_18);
  }
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  ::__normal_iterator(&local_f0);
  local_f8 = (Molecule **)
             std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::begin
                       ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                        in_stack_fffffffffffffe88);
  local_f0._M_current = local_f8;
  while( true ) {
    local_100 = (Molecule **)
                std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::end
                          ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                           in_stack_fffffffffffffe88);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar2) break;
    ppMVar4 = __gnu_cxx::
              __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
              ::operator*(&local_f0);
    local_20 = *ppMVar4;
    local_138 = 0.0;
    Vector<double,_3U>::Vector(&local_130,&local_138);
    Vector3<double>::Vector3(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    RVar6 = getZFOfMovingMols((ZConstraintForceModifier *)in_stack_fffffffffffffea0,
                              in_stack_fffffffffffffe98,(RealType)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe90 = (Vector3<double> *)((ulong)RVar6 ^ 0x8000000000000000);
    pdVar5 = Vector<double,_3U>::operator[](&local_118,2);
    *pdVar5 = (double)in_stack_fffffffffffffe90;
    local_28 = (Molecule *)
               Molecule::beginIntegrableObject
                         (in_stack_fffffffffffffeb0,(iterator *)in_stack_fffffffffffffea8);
    while (local_28 != (Molecule *)0x0) {
      StuntDouble::addFrc((StuntDouble *)in_stack_fffffffffffffea0,
                          (Vector3d *)in_stack_fffffffffffffe98);
      local_28 = (Molecule *)
                 Molecule::nextIntegrableObject
                           (in_stack_fffffffffffffeb0,(iterator *)in_stack_fffffffffffffea8);
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator++(&local_f0);
  }
  return;
}

Assistant:

void ZConstraintForceModifier::doZconstraintForce() {
    RealType totalFZ(0.0);

    // Calculate the total z-contraint force on the fixed molecules:

    std::list<ZconstraintMol>::iterator i;
    Molecule* mol;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;

    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol   = i->mol;
      i->fz = 0.0;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        i->fz += (sd->getFrc())[whichDirection];
      }

      totalFZ += i->fz;
    }

#ifdef IS_MPI
    // collect the total z-constraint force
    MPI_Allreduce(MPI_IN_PLACE, &totalFZ, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // apply negative force to fixed z-constrained molecules:
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol = i->mol;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        Vector3d force(0.0);
        force[whichDirection] = -getZFOfFixedZMols(mol, sd, i->fz);

        sd->addFrc(force);
      }
    }

    // modify the forces of the currently moving z-constrained
    // molecules so that system stays fixed:
    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol = i->mol;

      Vector3d force(0.0);
      force[whichDirection] = -getZFOfMovingMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }

    // modify the forces of unconstrained molecules so that the system
    // stays fixed:
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol = *j;

      Vector3d force(0.0);
      force[whichDirection] = -getZFOfMovingMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }
  }